

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

string * __thiscall
glcts::ArraysOfArrays::ExpressionsAssignment1<glcts::ArraysOfArrays::Interface::GL>::
recursively_initialise
          (string *__return_storage_ptr__,
          ExpressionsAssignment1<glcts::ArraysOfArrays::Interface::GL> *this,string *var_type,
          size_t dimension_index,string *init_string)

{
  pointer pcVar1;
  int iVar2;
  long lVar3;
  undefined8 in_R9;
  bool bVar4;
  string prefix;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string local_f8;
  long *local_d8;
  char *local_d0;
  long local_c8 [2];
  ExpressionsAssignment1<glcts::ArraysOfArrays::Interface::GL> *local_b8;
  string local_b0;
  string local_90;
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  paVar5 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar5;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_b8 = this;
  if (dimension_index == 0) {
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  }
  else {
    local_d8 = local_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"\n","");
    if (dimension_index < 9) {
      lVar3 = dimension_index - 9;
      do {
        std::__cxx11::string::append((char *)&local_d8);
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0);
    }
    pcVar1 = (var_type->_M_dataplus)._M_p;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + var_type->_M_string_length);
    local_70[0] = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"[]","");
    (*(local_b8->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
      super_TestNode._vptr_TestNode[6])
              (&local_f8,local_b8,local_50,local_70,dimension_index,in_R9,paVar5);
    std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_70[0] != local_60) {
      operator_delete(local_70[0],local_60[0] + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    std::__cxx11::string::append((char *)&local_d8);
    iVar2 = 0;
    do {
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_d8);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      pcVar1 = (var_type->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,pcVar1,pcVar1 + var_type->_M_string_length);
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      pcVar1 = (init_string->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,pcVar1,pcVar1 + init_string->_M_string_length);
      recursively_initialise(&local_f8,local_b8,&local_b0,dimension_index - 1,&local_90);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace((ulong)&local_d8,0,local_d0,0x1ad75d0);
      bVar4 = iVar2 == 0;
      iVar2 = iVar2 + -1;
    } while ((dimension_index != 1) && (bVar4));
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if (local_d8 != local_c8) {
      operator_delete(local_d8,local_c8[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ExpressionsAssignment1<API>::recursively_initialise(std::string var_type, size_t dimension_index,
																std::string init_string)
{
	std::string temp_string;

	if (dimension_index == 0)
	{
		temp_string = init_string;
	}
	else
	{
		std::string prefix = "\n";

		for (size_t indent_index = dimension_index; indent_index < (API::MAX_ARRAY_DIMENSIONS + 1); indent_index++)
		{
			prefix += "    ";
		}

		prefix += this->extend_string(var_type, "[]", dimension_index);
		prefix += "(";
		for (int sub_script_index = 0; sub_script_index < 2; sub_script_index++)
		{
			temp_string += prefix;
			temp_string += recursively_initialise(var_type, dimension_index - 1, init_string);
			prefix = ", ";
			if (dimension_index == 1)
			{
				break;
			}
		}
		temp_string += ")";
	}

	return temp_string;
}